

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O0

void __thiscall
dd::TaskQueueStdlib::TaskQueueStdlib
          (TaskQueueStdlib *this,string *queue_name,ThreadPriority priority)

{
  ThreadPriority priority_local;
  string *queue_name_local;
  TaskQueueStdlib *this_local;
  
  TaskQueueBase::TaskQueueBase(&this->super_TaskQueueBase);
  (this->super_TaskQueueBase)._vptr_TaskQueueBase = (_func_int **)&PTR_Delete_001c0bf8;
  Event::Event(&this->_started,false,false);
  Event::Event(&this->_stopped,false,false);
  Event::Event(&this->_flag_notify,false,false);
  PlatformThread::PlatformThread(&this->_thread,ThreadMain,this,queue_name,priority);
  Lock::Lock(&this->_pending_lock);
  this->_thread_should_quit = false;
  this->_thread_posting_order = 0;
  std::
  queue<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::deque<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::allocator<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>>
  ::
  queue<std::deque<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::allocator<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>,void>
            ((queue<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::deque<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::allocator<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>>
              *)&this->_pending_queue);
  std::
  map<dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>,_std::less<dd::TaskQueueStdlib::DelayedEntryTimeout>,_std::allocator<std::pair<const_dd::TaskQueueStdlib::DelayedEntryTimeout,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>_>_>
  ::map(&this->_delayed_queue);
  PlatformThread::Start(&this->_thread);
  Event::Wait(&this->_started,-1);
  return;
}

Assistant:

TaskQueueStdlib::TaskQueueStdlib(const std::string &queue_name, ThreadPriority priority)
		:_started(false, false),
		_stopped(false, false),
		_flag_notify(false, false),
		_thread(&TaskQueueStdlib::ThreadMain, this, queue_name, priority)
	{
		_thread.Start();
		_started.Wait(-1);
	}